

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O0

void handlePrintOption(KinDynComputations *comp,parser *cmd)

{
  bool bVar1;
  ostream *this;
  string local_68 [8];
  allocator<char> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  parser *in_stack_ffffffffffffffb0;
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  bVar1 = cmdline::parser::exist(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    iDynTree::KinDynComputations::getRobotModel();
    iDynTree::Model::toString_abi_cxx11_();
    this = std::operator<<((ostream *)&std::cout,local_68);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_68);
  }
  return;
}

Assistant:

void handlePrintOption(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    if( !cmd.exist("print") )
    {
        return;
    }

    std::cout << comp.getRobotModel().toString() << std::endl;
}